

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeDebugExpression(Builder *this)

{
  Id IVar1;
  Id typeId;
  Instruction *this_00;
  value_type local_28;
  Instruction *local_20;
  Instruction *inst;
  Builder *this_local;
  
  if (this->debugExpression == 0) {
    inst = (Instruction *)this;
    this_00 = (Instruction *)::operator_new(0x60);
    IVar1 = getUniqueId(this);
    typeId = makeVoidType(this);
    spv::Instruction::Instruction(this_00,IVar1,typeId,OpExtInst);
    local_20 = this_00;
    spv::Instruction::reserveOperands(this_00,2);
    spv::Instruction::addIdOperand(local_20,this->nonSemanticShaderDebugInfo);
    spv::Instruction::addImmediateOperand(local_20,0x1f);
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_28,
               local_20);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_28);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_28);
    Module::mapInstruction(&this->module,local_20);
    IVar1 = spv::Instruction::getResultId(local_20);
    this->debugExpression = IVar1;
    this_local._4_4_ = this->debugExpression;
  }
  else {
    this_local._4_4_ = this->debugExpression;
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::makeDebugExpression()
{
    if (debugExpression != 0)
        return debugExpression;

    Instruction* inst = new Instruction(getUniqueId(), makeVoidType(), OpExtInst);
    inst->reserveOperands(2);
    inst->addIdOperand(nonSemanticShaderDebugInfo);
    inst->addImmediateOperand(NonSemanticShaderDebugInfo100DebugExpression);

    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(inst));
    module.mapInstruction(inst);

    debugExpression = inst->getResultId();

    return debugExpression;
}